

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

bool CompileModuleFromSource(CompilerContext *ctx)

{
  RegVmLoweredFunction *pRVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  ExprModule *pEVar5;
  ExpressionContext *ctx_00;
  VmModule *pVVar6;
  void *pvVar7;
  LlvmModule *pLVar8;
  RegVmLoweredModule *pRVar9;
  RegVmLoweredFunction **ppRVar10;
  char *codeStart;
  undefined1 local_108 [8];
  InstructionRegVmLowerGraphContext instRegVmLowerGraphCtx;
  TraceScope traceScope_3;
  RegVmLoweredFunction *function;
  InstructionVMGraphContext instGraphCtx_1;
  TraceScope traceScope_2;
  InstructionVMGraphContext instGraphCtx;
  TraceScope traceScope_1;
  ExpressionContext *exprCtx;
  undefined1 local_38 [8];
  TraceScope traceScope;
  CompilerContext *ctx_local;
  
  if ((CompileModuleFromSource(CompilerContext&)::token == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token), iVar3 != 0)) {
    CompileModuleFromSource::token = NULLC::TraceGetToken("compiler","CompileModuleFromSource");
    __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_38,CompileModuleFromSource::token);
  pEVar5 = AnalyzeModuleFromSource(ctx);
  if (pEVar5 == (ExprModule *)0x0) {
    ctx_local._7_1_ = false;
  }
  else {
    ctx_00 = &ctx->exprCtx;
    uVar4 = NULLCTime::clockMicro();
    CompilerStatistics::Start(&ctx->statistics,uVar4);
    pVVar6 = CompileVm(ctx_00,&ctx->exprModule->super_ExprBase,ctx->code);
    ctx->vmModule = pVVar6;
    uVar4 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(&ctx->statistics,"IrCodeGen",uVar4);
    if (ctx->vmModule == (VmModule *)0x0) {
      ctx->errorPos = (char *)0x0;
      if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
        NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                           "ERROR: internal compiler error: failed to create VmModule");
      }
      ctx_local._7_1_ = false;
    }
    else {
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Start(&ctx->statistics,uVar4);
      if ((ctx->enableLogFiles & 1U) != 0) {
        if ((CompileModuleFromSource(CompilerContext&)::token == '\0') &&
           (iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token),
           iVar3 != 0)) {
          CompileModuleFromSource(CompilerContext&)::token =
               NULLC::TraceGetToken("compiler","Debug::inst_graph");
          __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope
                  ((TraceScope *)&instGraphCtx.showTypes,
                   CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x266,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar7 = (*(ctx->outputCtx).openStream)("inst_graph.txt");
        (ctx->outputCtx).stream = pvVar7;
        if ((ctx->outputCtx).stream != (void *)0x0) {
          InstructionVMGraphContext::InstructionVMGraphContext
                    ((InstructionVMGraphContext *)&traceScope_2.lastEventPos,&ctx->outputCtx);
          instGraphCtx.lastStartOffset._2_1_ = 1;
          instGraphCtx.lastEndOffset._3_1_ = 0;
          instGraphCtx.lastStartOffset._1_1_ = 0;
          instGraphCtx.lastEndOffset._1_1_ = 1;
          PrintGraph((InstructionVMGraphContext *)&traceScope_2.lastEventPos,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope((TraceScope *)&instGraphCtx.showTypes);
      }
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"Logging",uVar4);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Start(&ctx->statistics,uVar4);
      pLVar8 = CompileLlvm(ctx_00,ctx->exprModule);
      ctx->llvmModule = pLVar8;
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"LlvmCodeGen",uVar4);
      OptimizeModule(ctx);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Start(&ctx->statistics,uVar4);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_UPDATE_LIVE_SETS);
      if (1 < ctx->optimizationLevel) {
        RunVmPass(ctx_00,ctx->vmModule,VM_PASS_PREPARE_SSA_EXIT);
      }
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_BITCASTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_LEGALIZE_EXTRACTS);
      RunVmPass(ctx_00,ctx->vmModule,VM_PASS_CREATE_ALLOCA_STORAGE);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"IrFinalization",uVar4);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Start(&ctx->statistics,uVar4);
      if ((ctx->enableLogFiles & 1U) != 0) {
        if ((CompileModuleFromSource(CompilerContext&)::token == '\0') &&
           (iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token),
           iVar3 != 0)) {
          CompileModuleFromSource(CompilerContext&)::token =
               NULLC::TraceGetToken("compiler","Debug::inst_graph_opt");
          __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
        }
        NULLC::TraceScope::TraceScope
                  ((TraceScope *)&instGraphCtx_1.showTypes,
                   CompileModuleFromSource(CompilerContext&)::token);
        if ((ctx->outputCtx).stream != (void *)0x0) {
          __assert_fail("!ctx.outputCtx.stream",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                        ,0x29c,"bool CompileModuleFromSource(CompilerContext &)");
        }
        pvVar7 = (*(ctx->outputCtx).openStream)("inst_graph_opt.txt");
        (ctx->outputCtx).stream = pvVar7;
        if ((ctx->outputCtx).stream != (void *)0x0) {
          InstructionVMGraphContext::InstructionVMGraphContext
                    ((InstructionVMGraphContext *)&function,&ctx->outputCtx);
          instGraphCtx_1.lastStartOffset._2_1_ = 1;
          instGraphCtx_1.lastEndOffset._3_1_ = 0;
          instGraphCtx_1.lastStartOffset._1_1_ = 0;
          instGraphCtx_1.lastEndOffset._1_1_ = 1;
          PrintGraph((InstructionVMGraphContext *)&function,ctx->vmModule);
          (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
          (ctx->outputCtx).stream = (void *)0x0;
        }
        NULLC::TraceScope::~TraceScope((TraceScope *)&instGraphCtx_1.showTypes);
      }
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Finish(&ctx->statistics,"Logging",uVar4);
      uVar4 = NULLCTime::clockMicro();
      CompilerStatistics::Start(&ctx->statistics,uVar4);
      pRVar9 = RegVmLowerModule(ctx_00,ctx->vmModule);
      ctx->regVmLoweredModule = pRVar9;
      bVar2 = SmallArray<RegVmLoweredFunction_*,_32U>::empty(&ctx->regVmLoweredModule->functions);
      if ((bVar2) ||
         (ppRVar10 = SmallArray<RegVmLoweredFunction_*,_32U>::back
                               (&ctx->regVmLoweredModule->functions),
         ((*ppRVar10)->hasRegisterOverflow & 1U) == 0)) {
        RegVmFinalizeModule(&ctx->instRegVmFinalizeCtx,ctx->regVmLoweredModule);
        uVar4 = NULLCTime::clockMicro();
        CompilerStatistics::Finish(&ctx->statistics,"IrLowering",uVar4);
        uVar4 = NULLCTime::clockMicro();
        CompilerStatistics::Start(&ctx->statistics,uVar4);
        if ((ctx->enableLogFiles & 1U) != 0) {
          if ((CompileModuleFromSource(CompilerContext&)::token == '\0') &&
             (iVar3 = __cxa_guard_acquire(&CompileModuleFromSource(CompilerContext&)::token),
             iVar3 != 0)) {
            CompileModuleFromSource(CompilerContext&)::token =
                 NULLC::TraceGetToken("compiler","Debug::inst_graph_reg_low");
            __cxa_guard_release(&CompileModuleFromSource(CompilerContext&)::token);
          }
          NULLC::TraceScope::TraceScope
                    ((TraceScope *)&instRegVmLowerGraphCtx.showSource,
                     CompileModuleFromSource(CompilerContext&)::token);
          if ((ctx->outputCtx).stream != (void *)0x0) {
            __assert_fail("!ctx.outputCtx.stream",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                          ,0x2d3,"bool CompileModuleFromSource(CompilerContext &)");
          }
          pvVar7 = (*(ctx->outputCtx).openStream)("inst_graph_reg_low.txt");
          (ctx->outputCtx).stream = pvVar7;
          if ((ctx->outputCtx).stream != (void *)0x0) {
            InstructionRegVmLowerGraphContext::InstructionRegVmLowerGraphContext
                      ((InstructionRegVmLowerGraphContext *)local_108,&ctx->outputCtx);
            instRegVmLowerGraphCtx.lastStartOffset._0_1_ = 1;
            PrintGraph((InstructionRegVmLowerGraphContext *)local_108,ctx->regVmLoweredModule);
            (*(ctx->outputCtx).closeStream)((ctx->outputCtx).stream);
            (ctx->outputCtx).stream = (void *)0x0;
          }
          NULLC::TraceScope::~TraceScope((TraceScope *)&instRegVmLowerGraphCtx.showSource);
        }
        uVar4 = NULLCTime::clockMicro();
        CompilerStatistics::Finish(&ctx->statistics,"Logging",uVar4);
        ctx_local._7_1_ = true;
      }
      else {
        ppRVar10 = SmallArray<RegVmLoweredFunction_*,_32U>::back
                             (&ctx->regVmLoweredModule->functions);
        pRVar1 = *ppRVar10;
        if ((pRVar1->registerOverflowLocation == (VmInstruction *)0x0) ||
           ((pRVar1->registerOverflowLocation->super_VmValue).source == (SynBase *)0x0)) {
          ctx->errorPos = (char *)0x0;
        }
        else {
          ctx->errorPos = ((pRVar1->registerOverflowLocation->super_VmValue).source)->begin->pos;
        }
        if (((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) &&
           (NULLC::SafeSprintf(ctx->errorBuf,(ulong)ctx->errorBufSize,
                               "ERROR: internal compiler error: register count overflow"),
           ctx->errorPos != (char *)0x0)) {
          codeStart = FindModuleCodeWithSourceLocation(&ctx->exprCtx,ctx->errorPos);
          AddErrorLocationInfo(codeStart,ctx->errorPos,ctx->errorBuf,ctx->errorBufSize);
        }
        ctx_local._7_1_ = false;
      }
    }
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_38);
  return ctx_local._7_1_;
}

Assistant:

bool CompileModuleFromSource(CompilerContext &ctx)
{
	TRACE_SCOPE("compiler", "CompileModuleFromSource");

	if(!AnalyzeModuleFromSource(ctx))
		return false;

	ExpressionContext &exprCtx = ctx.exprCtx;

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.vmModule = CompileVm(exprCtx, ctx.exprModule, ctx.code);

	ctx.statistics.Finish("IrCodeGen", NULLCTime::clockMicro());

	if(!ctx.vmModule)
	{
		ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: failed to create VmModule");

		return false;
	}

	//printf("# Instruction memory %dkb\n", pool.GetSize() / 1024);

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	// Build LLVM module is support is enabled or just to test execution paths in debug build
#if defined(NULLC_LLVM_SUPPORT)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#elif !defined(NDEBUG)
	ctx.llvmModule = CompileLlvm(exprCtx, ctx.exprModule);
#endif

	ctx.statistics.Finish("LlvmCodeGen", NULLCTime::clockMicro());

	OptimizeModule(ctx);

	ctx.statistics.Start(NULLCTime::clockMicro());

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_UPDATE_LIVE_SETS);

	if(ctx.optimizationLevel >= 2)
		RunVmPass(exprCtx, ctx.vmModule, VM_PASS_PREPARE_SSA_EXIT);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_BITCASTS);
	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_LEGALIZE_EXTRACTS);

	RunVmPass(exprCtx, ctx.vmModule, VM_PASS_CREATE_ALLOCA_STORAGE);

	ctx.statistics.Finish("IrFinalization", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_opt");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_opt.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionVMGraphContext instGraphCtx(ctx.outputCtx);

			instGraphCtx.showUsers = true;
			instGraphCtx.displayAsTree = false;
			instGraphCtx.showFullTypes = false;
			instGraphCtx.showSource = true;

			PrintGraph(instGraphCtx, ctx.vmModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	ctx.regVmLoweredModule = RegVmLowerModule(exprCtx, ctx.vmModule);

	if(!ctx.regVmLoweredModule->functions.empty() && ctx.regVmLoweredModule->functions.back()->hasRegisterOverflow)
	{
		RegVmLoweredFunction *function = ctx.regVmLoweredModule->functions.back();

		if(function->registerOverflowLocation && function->registerOverflowLocation->source)
			ctx.errorPos = function->registerOverflowLocation->source->begin->pos;
		else
			ctx.errorPos = NULL;

		if(ctx.errorBuf && ctx.errorBufSize)
		{
			NULLC::SafeSprintf(ctx.errorBuf, ctx.errorBufSize, "ERROR: internal compiler error: register count overflow");

			if(ctx.errorPos)
				AddErrorLocationInfo(FindModuleCodeWithSourceLocation(ctx.exprCtx, ctx.errorPos), ctx.errorPos, ctx.errorBuf, ctx.errorBufSize);
		}

		return false;
	}

	RegVmFinalizeModule(ctx.instRegVmFinalizeCtx, ctx.regVmLoweredModule);

	ctx.statistics.Finish("IrLowering", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	if(ctx.enableLogFiles)
	{
		TRACE_SCOPE("compiler", "Debug::inst_graph_reg_low");

		assert(!ctx.outputCtx.stream);
		ctx.outputCtx.stream = ctx.outputCtx.openStream("inst_graph_reg_low.txt");

		if(ctx.outputCtx.stream)
		{
			InstructionRegVmLowerGraphContext instRegVmLowerGraphCtx(ctx.outputCtx);

			instRegVmLowerGraphCtx.showSource = true;

			PrintGraph(instRegVmLowerGraphCtx, ctx.regVmLoweredModule);

			ctx.outputCtx.closeStream(ctx.outputCtx.stream);
			ctx.outputCtx.stream = NULL;
		}
	}

	ctx.statistics.Finish("Logging", NULLCTime::clockMicro());

	return true;
}